

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CPrimitiveMode::Run<glcts::(anonymous_namespace)::test_api::ES3>
          (CPrimitiveMode *this,bool pointMode)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  long *plVar2;
  runtime_error *this_01;
  uint uVar3;
  size_type *psVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  undefined7 in_register_00000031;
  CColorArray coords;
  CColorArray padding;
  CColorArray bufferTest3;
  CColorArray bufferTest;
  CElementArray elements;
  CColorArray bufferTest5;
  CColorArray bufferTest4;
  CColorArray bufferRef5;
  CColorArray bufferRef3;
  DrawArraysIndirectCommand indirectArrays;
  CColorArray bufferRef4;
  CColorArray bufferRef2;
  CColorArray bufferRef1;
  DrawElementsIndirectCommand indirectElements;
  DIResult result;
  allocator_type local_c39;
  string local_c38;
  string local_c18;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_bf8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_bd8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_bc0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_ba8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_b88;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_b68;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_b50;
  uint local_b38 [4];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_b28;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_b08;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_af0;
  uint local_ad8 [8];
  value_type local_ab8;
  undefined1 local_aa8 [8];
  _func_int **pp_Stack_aa0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a98 [23];
  long local_928;
  DILogger local_920;
  DILogger local_7a0;
  DILogger local_620;
  DILogger local_4a0;
  DILogger local_320;
  DILogger local_1a0;
  
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glClear(this_00,0x4000);
  if ((int)CONCAT71(in_register_00000031,pointMode) == 0) {
    anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  }
  else {
    local_a98[0]._M_allocated_capacity._0_7_ = 0x6f697372657623;
    local_a98[0]._M_local_buf[7] = 'n';
    local_a98[0]._8_7_ = 0x73652030313320;
    pp_Stack_aa0 = (_func_int **)0xf;
    local_a98[0]._M_local_buf[0xf] = '\0';
    local_aa8 = (undefined1  [8])local_a98;
    plVar2 = (long *)std::__cxx11::string::append(local_aa8);
    local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_c38.field_2._M_allocated_capacity = *psVar4;
      local_c38.field_2._8_8_ = plVar2[3];
    }
    else {
      local_c38.field_2._M_allocated_capacity = *psVar4;
      local_c38._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_c38._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_aa8 != (undefined1  [8])local_a98) {
      operator_delete((void *)local_aa8,
                      CONCAT17(local_a98[0]._M_local_buf[7],
                               (undefined7)local_a98[0]._M_allocated_capacity) + 1);
    }
  }
  local_aa8 = (undefined1  [8])local_a98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,0x1b32ab9);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_c38,(string *)local_aa8,&local_c18,true);
  this->_program = GVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  if (local_aa8 != (undefined1  [8])local_a98) {
    operator_delete((void *)local_aa8,
                    CONCAT17(local_a98[0]._M_local_buf[7],
                             (undefined7)local_a98[0]._M_allocated_capacity) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
    operator_delete(local_c38._M_dataplus._M_p,local_c38.field_2._M_allocated_capacity + 1);
  }
  if (this->_program == 0) {
    lVar5 = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    local_c38._M_dataplus._M_p = (pointer)0x0;
    local_c38._M_string_length = 0;
    local_c38.field_2._M_allocated_capacity = 0;
    DrawIndirectBase::PrimitiveGen
              (&this->super_DrawIndirectBase,this->_primitiveType,this->_drawSizeX,this->_drawSizeY,
               (CColorArray *)&local_c38);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    local_aa8 = (undefined1  [8])0x0;
    pp_Stack_aa0 = (_func_int **)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_c18,
               10,(value_type *)local_aa8,(allocator_type *)&local_bc0);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               local_c18._M_string_length +
               (local_c38._M_string_length -
               (long)(local_c38._M_dataplus._M_p + local_c18._M_dataplus._M_p)) & 0xfffffffffffffff0
               ,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glBufferSubData
              (this_00,0x8892,0,local_c18._M_string_length - (long)local_c18._M_dataplus._M_p,
               local_c18._M_dataplus._M_p);
    glu::CallLogWrapper::glBufferSubData
              (this_00,0x8892,local_c18._M_string_length - (long)local_c18._M_dataplus._M_p,
               local_c38._M_string_length - (long)local_c38._M_dataplus._M_p,
               local_c38._M_dataplus._M_p);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_ad8[4] = 0;
    local_ad8[0] = 0;
    local_ad8[1] = 0;
    local_ad8[2] = 0;
    local_ad8[3] = 0;
    local_b38[0] = 0;
    local_b38[1] = 0;
    local_b38[2] = 0;
    local_b38[3] = 0;
    local_aa8 = (undefined1  [8])((ulong)local_aa8 & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_bc0,(long)(local_c38._M_string_length - (long)local_c38._M_dataplus._M_p) >> 4
               ,(value_type_conflict4 *)local_aa8,(allocator_type *)&local_af0);
    if ((long)local_bc0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_bc0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_bc0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_bc0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2;
      lVar7 = 0;
      do {
        local_bc0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] = (uint)lVar7;
        lVar7 = lVar7 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
    }
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    if (this->_drawFunc == DRAW_ARRAYS) {
      local_b38[0] = (uint)(local_c38._M_string_length - (long)local_c38._M_dataplus._M_p >> 5) &
                     0x7fffffff;
      local_b38[1] = 1;
      local_b38[2] = 10;
      local_b38[3] = 0;
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,(void *)0x0,0x88e4);
      glu::CallLogWrapper::glBufferSubData(this_00,0x8f3f,0,0x10,local_b38);
      glu::CallLogWrapper::glDrawArraysIndirect(this_00,this->_primitiveType,(void *)0x0);
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown draw function!");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_ad8[0] = (uint)(local_c38._M_string_length - (long)local_c38._M_dataplus._M_p >> 5) &
                     0x7fffffff;
      local_ad8[1] = 1;
      local_ad8[2] = 3;
      local_ad8[3] = 7;
      local_ad8[4] = 0;
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,(void *)0x0,0x88e4);
      glu::CallLogWrapper::glBufferSubData(this_00,0x8f3f,0,0x14,local_ad8);
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8893,
                 (long)local_bc0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_bc0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                 local_bc0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e4);
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,this->_primitiveType,0x1405,(void *)0x0);
    }
    local_aa8 = (undefined1  [8])0x0;
    pp_Stack_aa0 = (_func_int **)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_af0,(ulong)(this->_sizeY * this->_sizeX >> 1),(value_type *)local_aa8,
               (allocator_type *)&local_b08);
    local_aa8 = (undefined1  [8])0x3e4ccccd3dcccccd;
    pp_Stack_aa0 = (_func_int **)0x3f8000003e99999a;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_b08,(ulong)(this->_sizeY * this->_sizeX >> 1),(value_type *)local_aa8,
               (allocator_type *)&local_bd8);
    local_aa8 = (undefined1  [8])0x0;
    pp_Stack_aa0 = (_func_int **)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_bd8,(ulong)(this->_sizeY * this->_sizeX),(value_type *)local_aa8,
               (allocator_type *)&local_b50);
    local_aa8 = (undefined1  [8])((ulong)local_aa8 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_aa0);
    local_928 = 0;
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
              (&this->super_DrawIndirectBase,0,this->_sizeY + 1 >> 1,this->_sizeX,this->_sizeY >> 1,
               local_bd8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    uVar3 = this->_sizeY >> 1;
    lVar5 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&local_bd8,this->_sizeX,uVar3,&local_af0,
                       this->_sizeX,uVar3);
    DIResult::sub_result(&local_1a0,(DIResult *)local_aa8,lVar5);
    DILogger::~DILogger(&local_1a0);
    if ((this->_primitiveType & 0xfffffffe) == 0xc) {
      local_b28.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b28.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_b50,(ulong)(this->_sizeY * this->_sizeX >> 4),(value_type *)&local_b28,
                 (allocator_type *)&local_b68);
      local_b68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x3e4ccccd3dcccccd;
      local_b68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f8000003e99999a;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_b28,(ulong)(this->_sizeY * this->_sizeX >> 3),(value_type *)&local_b68,
                 (allocator_type *)&local_bf8);
      local_bf8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_bf8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_b68,(ulong)(this->_sizeY * this->_sizeX >> 2),(value_type *)&local_bf8,
                 (allocator_type *)&local_b88);
      local_b88.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b88.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_bf8,(ulong)(this->_sizeY * this->_sizeX >> 4),(value_type *)&local_b88,
                 (allocator_type *)&local_ba8);
      local_ba8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_ba8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_b88,(ulong)(this->_sizeY * this->_sizeX >> 3),(value_type *)&local_ba8,
                 (allocator_type *)&local_ab8);
      local_ab8.m_data[0] = 0.0;
      local_ab8.m_data[1] = 0.0;
      local_ab8.m_data[2] = 0.0;
      local_ab8.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_ba8,(ulong)(this->_sizeY * this->_sizeX >> 2),&local_ab8,&local_c39);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,0,this->_sizeY + 3 >> 2,this->_sizeX >> 2,
                 this->_sizeY >> 2,
                 local_bf8.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      uVar6 = this->_sizeX >> 2;
      uVar3 = this->_sizeY >> 2;
      lVar5 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&local_bf8,uVar6,uVar3,&local_b50,uVar6,uVar3);
      DIResult::sub_result(&local_320,(DIResult *)local_aa8,lVar5);
      DILogger::~DILogger(&local_320);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,this->_sizeX + 3 >> 2,this->_sizeY + 3 >> 2,
                 this->_sizeX >> 1,this->_sizeY >> 2,
                 local_b88.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      uVar6 = this->_sizeX >> 1;
      uVar3 = this->_sizeY >> 2;
      lVar5 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&local_b88,uVar6,uVar3,&local_b28,uVar6,uVar3);
      DIResult::sub_result(&local_4a0,(DIResult *)local_aa8,lVar5);
      DILogger::~DILogger(&local_4a0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,this->_sizeX * 3 + 3 >> 2,this->_sizeY + 3 >> 2,
                 this->_sizeX >> 2,this->_sizeY >> 2,
                 local_bf8.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      uVar6 = this->_sizeX >> 2;
      uVar3 = this->_sizeY >> 2;
      lVar5 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&local_bf8,uVar6,uVar3,&local_b50,uVar6,uVar3);
      DIResult::sub_result(&local_620,(DIResult *)local_aa8,lVar5);
      DILogger::~DILogger(&local_620);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,0,0,this->_sizeX,this->_sizeY >> 2,
                 local_ba8.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      uVar3 = this->_sizeY >> 2;
      lVar5 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&local_ba8,this->_sizeX,uVar3,&local_b68,
                         this->_sizeX,uVar3);
      DIResult::sub_result(&local_7a0,(DIResult *)local_aa8,lVar5);
      DILogger::~DILogger(&local_7a0);
      if (local_ba8.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_ba8.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_ba8.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_ba8.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b88.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b88.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b88.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b88.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_bf8.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_bf8.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_bf8.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_bf8.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b68.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b68.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b68.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b68.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b28.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b28.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b28.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b28.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b50.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b50.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b50.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b50.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,0,0,this->_sizeX,this->_sizeY >> 1,
                 local_bd8.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      uVar3 = this->_sizeY >> 1;
      lVar5 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&local_bd8,this->_sizeX,uVar3,&local_b08,
                         this->_sizeX,uVar3);
      DIResult::sub_result(&local_920,(DIResult *)local_aa8,lVar5);
      DILogger::~DILogger(&local_920);
    }
    lVar5 = local_928;
    DILogger::~DILogger((DILogger *)local_aa8);
    if (local_bd8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_bd8.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_bd8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_bd8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b08.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b08.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b08.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b08.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_af0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_af0.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_af0.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_af0.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_bc0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_bc0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_bc0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_bc0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c18._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_c18._M_dataplus._M_p,
                      local_c18.field_2._M_allocated_capacity - (long)local_c18._M_dataplus._M_p);
    }
    if (local_c38._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_c38._M_dataplus._M_p,
                      local_c38.field_2._M_allocated_capacity - (long)local_c38._M_dataplus._M_p);
    }
  }
  return lVar5;
}

Assistant:

long Run(bool pointMode = false)
	{

		glClear(GL_COLOR_BUFFER_BIT);

		_program = CreateProgram(pointMode ? shaders::vshSimple_point<api>() : shaders::vshSimple<api>(), "",
								 shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(_primitiveType, _drawSizeX, _drawSizeY, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		CColorArray padding(10, tcu::Vec4(0.0f));

		glBufferData(GL_ARRAY_BUFFER,
					 (GLsizeiptr)(coords.size() * (sizeof(coords[0])) + padding.size() * (sizeof(padding[0]))), NULL,
					 GL_STREAM_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, (GLsizeiptr)(padding.size() * (sizeof(padding[0]))), &padding[0]);
		glBufferSubData(GL_ARRAY_BUFFER, (GLintptr)(padding.size() * (sizeof(padding[0]))),
						(GLsizeiptr)(coords.size() * (sizeof(coords[0]))), &coords[0]);

		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		DrawArraysIndirectCommand   indirectArrays   = { 0, 0, 0, 0 };

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			indirectArrays.count			  = static_cast<GLuint>(coords.size()) / 2;
			indirectArrays.primCount		  = 1;
			indirectArrays.first			  = 10;
			indirectArrays.reservedMustBeZero = 0;

			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), NULL, GL_STATIC_DRAW);
			glBufferSubData(GL_DRAW_INDIRECT_BUFFER, 0, sizeof(DrawArraysIndirectCommand), &indirectArrays);

			glDrawArraysIndirect(_primitiveType, 0);
		}
		break;
		case DRAW_ELEMENTS:
		{
			indirectElements.count				= static_cast<GLuint>(coords.size()) / 2;
			indirectElements.primCount			= 1;
			indirectElements.baseVertex			= 7;
			indirectElements.firstIndex			= 3;
			indirectElements.reservedMustBeZero = 0;

			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), NULL, GL_STATIC_DRAW);
			glBufferSubData(GL_DRAW_INDIRECT_BUFFER, 0, sizeof(DrawElementsIndirectCommand), &indirectElements);

			glGenBuffers(1, &_ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
						 GL_STATIC_DRAW);

			glDrawElementsIndirect(_primitiveType, GL_UNSIGNED_INT, 0);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef1(_sizeX * _sizeY / 2, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		CColorArray bufferRef2(_sizeX * _sizeY / 2, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(_sizeX * _sizeY, tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, (_sizeY + 1) / 2, _sizeX, _sizeY / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, _sizeX, _sizeY / 2, bufferRef1, _sizeX, _sizeY / 2));

		switch (_primitiveType)
		{
		case GL_TRIANGLES_ADJACENCY:
		case GL_TRIANGLE_STRIP_ADJACENCY:
		{
			CColorArray bufferRef3(_sizeX * _sizeY / 16, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
			CColorArray bufferRef4(_sizeX * _sizeY / 8, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
			CColorArray bufferRef5(_sizeX * _sizeY / 4, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));

			CColorArray bufferTest3(_sizeX * _sizeY / 16, tcu::Vec4(0.0f));
			CColorArray bufferTest4(_sizeX * _sizeY / 8, tcu::Vec4(0.0f));
			CColorArray bufferTest5(_sizeX * _sizeY / 4, tcu::Vec4(0.0f));

			ReadPixelsFloat<api>(0, (_sizeY + 3) / 4, _sizeX / 4, _sizeY / 4, &bufferTest3[0]);
			result.sub_result(BuffersCompare(bufferTest3, _sizeX / 4, _sizeY / 4, bufferRef3, _sizeX / 4, _sizeY / 4));

			ReadPixelsFloat<api>((_sizeX + 3) / 4, (_sizeY + 3) / 4, _sizeX / 2, _sizeY / 4, &bufferTest4[0]);
			result.sub_result(BuffersCompare(bufferTest4, _sizeX / 2, _sizeY / 4, bufferRef4, _sizeX / 2, _sizeY / 4));

			ReadPixelsFloat<api>((_sizeX * 3 + 3) / 4, (_sizeY + 3) / 4, _sizeX / 4, _sizeY / 4, &bufferTest3[0]);
			result.sub_result(BuffersCompare(bufferTest3, _sizeX / 4, _sizeY / 4, bufferRef3, _sizeX / 4, _sizeY / 4));

			ReadPixelsFloat<api>(0, 0, _sizeX, _sizeY / 4, &bufferTest5[0]);
			result.sub_result(BuffersCompare(bufferTest5, _sizeX, _sizeY / 4, bufferRef5, _sizeX, _sizeY / 4));
		}
		break;
		default:
		{
			ReadPixelsFloat<api>(0, 0, _sizeX, _sizeY / 2, &bufferTest[0]);
			result.sub_result(BuffersCompare(bufferTest, _sizeX, _sizeY / 2, bufferRef2, _sizeX, _sizeY / 2));
		}
		break;
		}

		return result.code();
	}